

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.hpp
# Opt level: O0

uint16_t __thiscall helics::FederateState::getInterfaceFlags(FederateState *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(seq_cst,__memory_order_mask);
  return *(uint16_t *)(in_RDI + 0x488);
}

Assistant:

uint16_t getInterfaceFlags() const { return interfaceFlags.load(); }